

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O0

void Wlc_WinProfileArith(Wlc_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vLeaves_00;
  Vec_Int_t *vNodes_00;
  Wlc_Obj_t *pWVar3;
  char *pcVar4;
  uint local_30;
  int local_2c;
  int Count;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vNodes;
  Vec_Int_t *vLeaves;
  Wlc_Ntk_t *p_local;
  
  vLeaves_00 = Vec_IntAlloc(1000);
  vNodes_00 = Vec_IntAlloc(1000);
  local_30 = 0;
  for (local_2c = 1; iVar1 = Wlc_NtkObjNumMax(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pWVar3 = Wlc_NtkObj(p,local_2c);
    *(ushort *)pWVar3 = *(ushort *)pWVar3 & 0xff7f;
  }
  for (local_2c = 1; iVar1 = Wlc_NtkObjNumMax(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pWVar3 = Wlc_NtkObj(p,local_2c);
    iVar1 = Wlc_ObjHasArithm_rec(p,pWVar3);
    if (iVar1 == 0) {
      iVar1 = Wlc_ObjHasArithmFanins(p,pWVar3);
    }
    else {
      iVar1 = Wlc_ObjIsCo(pWVar3);
    }
    if (iVar1 != 0) {
      Wlc_WinCompute(p,pWVar3,vLeaves_00,vNodes_00);
      iVar1 = Wlc_ManCountArithmReal(p,vNodes_00);
      if (1 < iVar1) {
        uVar2 = Wlc_ObjId(p,pWVar3);
        iVar1 = Wlc_ObjId(p,pWVar3);
        pcVar4 = Wlc_ObjName(p,iVar1);
        printf("Arithmetic cone of node %d (%s):\n",(ulong)uVar2,pcVar4);
        Wlc_NtkPrintNode(p,pWVar3);
        Vec_IntReverseOrder(vNodes_00);
        Wlc_NtkPrintNodeArray(p,vNodes_00);
        printf("\n");
        local_30 = local_30 + 1;
      }
    }
  }
  local_2c = 1;
  while( true ) {
    iVar1 = Wlc_NtkObjNumMax(p);
    if (iVar1 <= local_2c) {
      printf("Finished printing %d arithmetic cones.\n",(ulong)local_30);
      Vec_IntFree(vLeaves_00);
      Vec_IntFree(vNodes_00);
      return;
    }
    pWVar3 = Wlc_NtkObj(p,local_2c);
    if ((*(ushort *)pWVar3 >> 7 & 1) != 0) break;
    local_2c = local_2c + 1;
  }
  __assert_fail("pObj->Mark == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcWin.c"
                ,0x9a,"void Wlc_WinProfileArith(Wlc_Ntk_t *)");
}

Assistant:

void Wlc_WinProfileArith( Wlc_Ntk_t * p )
{
    Vec_Int_t * vLeaves = Vec_IntAlloc( 1000 );
    Vec_Int_t * vNodes  = Vec_IntAlloc( 1000 );
    Wlc_Obj_t * pObj; int i, Count = 0;
    Wlc_NtkForEachObj( p, pObj, i )
        pObj->Mark = 0;
    Wlc_NtkForEachObj( p, pObj, i )
        if ( Wlc_ObjHasArithm_rec(p, pObj) ? Wlc_ObjIsCo(pObj) : Wlc_ObjHasArithmFanins(p, pObj) )
        {
            Wlc_WinCompute( p, pObj, vLeaves, vNodes ); 
            if ( Wlc_ManCountArithmReal(p, vNodes) < 2 )
                continue;

            printf( "Arithmetic cone of node %d (%s):\n", Wlc_ObjId(p, pObj), Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
            Wlc_NtkPrintNode( p, pObj );
            Vec_IntReverseOrder( vNodes );
            Wlc_NtkPrintNodeArray( p, vNodes );
            printf( "\n" );
            Count++;
        }
    Wlc_NtkForEachObj( p, pObj, i )
        assert( pObj->Mark == 0 );
    printf( "Finished printing %d arithmetic cones.\n", Count );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vNodes );
}